

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

int64_t bson_iter_as_int64(bson_iter_t *iter)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  _Bool _Var3;
  ulong uVar4;
  
  if (iter != (bson_iter_t *)0x0) {
    puVar2 = iter->raw;
    uVar1 = puVar2[iter->type];
    if (uVar1 == '\x01') {
      uVar4 = (ulong)*(double *)(puVar2 + iter->d1);
    }
    else if (uVar1 == '\x12') {
      uVar4 = *(ulong *)(puVar2 + iter->d1);
    }
    else if (uVar1 == '\x10') {
      uVar4 = (ulong)*(int *)(puVar2 + iter->d1);
    }
    else if (uVar1 == '\b') {
      _Var3 = bson_iter_bool(iter);
      uVar4 = (ulong)_Var3;
    }
    else {
      uVar4 = 0;
    }
    return uVar4;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,0x466,"bson_iter_as_int64","iter");
  abort();
}

Assistant:

int64_t
bson_iter_as_int64 (const bson_iter_t *iter) /* IN */
{
   BSON_ASSERT (iter);

   switch ((int) ITER_TYPE (iter)) {
   case BSON_TYPE_BOOL:
      return (int64_t) bson_iter_bool (iter);
   case BSON_TYPE_DOUBLE:
      return (int64_t) bson_iter_double (iter);
   case BSON_TYPE_INT64:
      return bson_iter_int64 (iter);
   case BSON_TYPE_INT32:
      return (int64_t) bson_iter_int32 (iter);
   default:
      return 0;
   }
}